

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode_accessors.c
# Opt level: O0

uint32_t aec_get_msb_32(aec_stream *strm)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  uint32_t data;
  aec_stream *strm_local;
  
  bVar1 = *strm->next_in;
  bVar2 = strm->next_in[1];
  bVar3 = strm->next_in[2];
  bVar4 = strm->next_in[3];
  strm->next_in = strm->next_in + 4;
  strm->avail_in = strm->avail_in - 4;
  return (uint)bVar1 << 0x18 | (uint)bVar2 << 0x10 | (uint)bVar3 << 8 | (uint)bVar4;
}

Assistant:

uint32_t aec_get_msb_32(struct aec_stream *strm)
{
    uint32_t data;

    data = ((uint32_t)strm->next_in[0] << 24)
        | ((uint32_t)strm->next_in[1] << 16)
        | ((uint32_t)strm->next_in[2] << 8)
        | (uint32_t)strm->next_in[3];

    strm->next_in += 4;
    strm->avail_in -= 4;
    return data;
}